

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmexec.h
# Opt level: O0

double VMExec_Checked::DoFLOP(int flop,double v)

{
  double v_local;
  double dStack_10;
  int flop_local;
  
  switch(flop) {
  case 0:
    dStack_10 = ABS(v);
    break;
  case 1:
    dStack_10 = -v;
    break;
  case 2:
    dStack_10 = c_exp(v);
    break;
  case 3:
    dStack_10 = c_log(v);
    break;
  case 4:
    dStack_10 = c_log10(v);
    break;
  case 5:
    dStack_10 = c_sqrt(v);
    break;
  case 6:
    dStack_10 = ceil(v);
    break;
  case 7:
    dStack_10 = ::floor(v);
    break;
  case 8:
    dStack_10 = c_acos(v);
    break;
  case 9:
    dStack_10 = c_asin(v);
    break;
  case 10:
    dStack_10 = c_atan(v);
    break;
  case 0xb:
    dStack_10 = fastcos(v);
    break;
  case 0xc:
    dStack_10 = fastsin(v);
    break;
  case 0xd:
    dStack_10 = c_tan(v);
    break;
  case 0xe:
    dStack_10 = c_acos(v);
    dStack_10 = dStack_10 * 57.29577951308232;
    break;
  case 0xf:
    dStack_10 = c_asin(v);
    dStack_10 = dStack_10 * 57.29577951308232;
    break;
  case 0x10:
    dStack_10 = c_atan(v);
    dStack_10 = dStack_10 * 57.29577951308232;
    break;
  case 0x11:
    dStack_10 = fastcosdeg(v);
    break;
  case 0x12:
    dStack_10 = fastsindeg(v);
    break;
  case 0x13:
    dStack_10 = c_tan(v * 0.017453292519943295);
    break;
  case 0x14:
    dStack_10 = c_cosh(v);
    break;
  case 0x15:
    dStack_10 = c_sinh(v);
    break;
  case 0x16:
    dStack_10 = c_tanh(v);
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/vmexec.h"
                  ,0x569,"static double VMExec_Checked::DoFLOP(int, double)");
  }
  return dStack_10;
}

Assistant:

static double DoFLOP(int flop, double v)
{
	switch(flop)
	{
	case FLOP_ABS:		return fabs(v);
	case FLOP_NEG:		return -v;
	case FLOP_EXP:		return g_exp(v);
	case FLOP_LOG:		return g_log(v);
	case FLOP_LOG10:	return g_log10(v);
	case FLOP_SQRT:		return g_sqrt(v);
	case FLOP_CEIL:		return ceil(v);
	case FLOP_FLOOR:	return floor(v);

	case FLOP_ACOS:		return g_acos(v);
	case FLOP_ASIN:		return g_asin(v);
	case FLOP_ATAN:		return g_atan(v);
	case FLOP_COS:		return g_cos(v);
	case FLOP_SIN:		return g_sin(v);
	case FLOP_TAN:		return g_tan(v);

	case FLOP_ACOS_DEG:	return g_acos(v) * (180 / M_PI);
	case FLOP_ASIN_DEG:	return g_asin(v) * (180 / M_PI);
	case FLOP_ATAN_DEG:	return g_atan(v) * (180 / M_PI);
	case FLOP_COS_DEG:	return g_cosdeg(v);
	case FLOP_SIN_DEG:	return g_sindeg(v);
	case FLOP_TAN_DEG:	return g_tan(v * (M_PI / 180));

	case FLOP_COSH:		return g_cosh(v);
	case FLOP_SINH:		return g_sinh(v);
	case FLOP_TANH:		return g_tanh(v);
	}
	assert(0);
	return 0;
}